

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brotli_bit_stream.cc
# Opt level: O1

void brotli::BuildAndStoreHuffmanTreeFast
               (uint32_t *histogram,size_t histogram_total,size_t max_bits,uint8_t *depth,
               uint16_t *bits,size_t *storage_ix,uint8_t *storage)

{
  HuffmanTree *__dest;
  uint uVar1;
  uint uVar2;
  HuffmanTree HVar3;
  ulong uVar4;
  HuffmanTree *pHVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  HuffmanTree *__first;
  long lVar9;
  HuffmanTree *pHVar10;
  HuffmanTree *pHVar11;
  HuffmanTree *pHVar12;
  int iVar13;
  ulong uVar14;
  byte *pbVar15;
  ulong uVar16;
  int iVar17;
  byte *pbVar18;
  byte bVar19;
  ulong uVar20;
  int iVar21;
  byte *pbVar22;
  ulong uVar23;
  int iVar24;
  size_t sVar25;
  long lVar26;
  HuffmanTree *pHVar27;
  byte bVar28;
  value_type __val;
  uint uVar29;
  value_type __val_1;
  size_t __n;
  size_t symbols [4];
  ulong local_a8 [5];
  ulong local_80;
  uint16_t *local_78;
  ulong local_70;
  HuffmanTree *local_68;
  long local_60;
  byte *local_58;
  long local_50;
  long local_48;
  HuffmanTree *local_40;
  uint32_t *local_38;
  
  local_a8[2] = 0;
  local_a8[3] = 0;
  local_a8[0] = 0;
  local_a8[1] = 0;
  if (histogram_total == 0) {
    uVar20 = 0;
    uVar14 = 0;
  }
  else {
    uVar14 = 0;
    uVar20 = 0;
    do {
      uVar29 = histogram[uVar20];
      if ((ulong)uVar29 != 0) {
        if (uVar14 < 4) {
          local_a8[uVar14] = uVar20;
        }
        uVar14 = uVar14 + 1;
        histogram_total = histogram_total - uVar29;
      }
      uVar20 = uVar20 + 1;
    } while (histogram_total != 0);
  }
  if (uVar14 < 2) {
    uVar8 = *storage_ix;
    *(ulong *)(storage + (uVar8 >> 3)) = (ulong)storage[uVar8 >> 3] | 1L << ((byte)uVar8 & 7);
    uVar8 = uVar8 + 4;
    *storage_ix = uVar8;
    if (local_a8[0] >> ((byte)max_bits & 0x3f) != 0) goto LAB_00179793;
    if (0x38 < max_bits) goto LAB_001797b2;
    *(ulong *)(storage + (uVar8 >> 3)) =
         local_a8[0] << ((byte)uVar8 & 7) | (ulong)storage[uVar8 >> 3];
  }
  else {
    local_80 = max_bits;
    local_78 = bits;
    local_70 = uVar14;
    __first = (HuffmanTree *)malloc(uVar20 << 4 | 8);
    local_40 = __first + -1;
    __dest = __first + 1;
    local_68 = __first + 0x10;
    local_58 = depth + 1;
    local_48 = (uVar20 << 0x30) + -0x100000000;
    local_60 = uVar20 - 1;
    uVar29 = 1;
    local_38 = histogram;
    do {
      pHVar27 = __first;
      if (uVar20 == 0) {
        lVar26 = 0;
      }
      else {
        lVar26 = 0;
        lVar9 = local_48;
        uVar14 = uVar20;
        do {
          uVar1 = local_38[uVar14 - 1];
          if (uVar1 != 0) {
            if (uVar1 <= uVar29) {
              uVar1 = uVar29;
            }
            *pHVar27 = (HuffmanTree)((ulong)uVar1 + lVar9);
            lVar26 = lVar26 + 8;
          }
          uVar14 = uVar14 - 1;
          pHVar27 = (HuffmanTree *)((long)&__first->total_count_ + lVar26);
          lVar9 = lVar9 + -0x1000000000000;
        } while (uVar14 != 0);
      }
      uVar14 = (long)pHVar27 - (long)__first;
      local_a8[4] = uVar14;
      if (lVar26 != 0) {
        lVar9 = 0x3f;
        if ((long)uVar14 >> 3 != 0) {
          for (; (ulong)((long)uVar14 >> 3) >> lVar9 == 0; lVar9 = lVar9 + -1) {
          }
        }
        std::
        __introsort_loop<brotli::HuffmanTree*,long,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(brotli::HuffmanTree_const&,brotli::HuffmanTree_const&)>>
                  (__first,pHVar27,(ulong)(((uint)lVar9 ^ 0x3f) * 2) ^ 0x7e,
                   (_Iter_comp_iter<bool_(*)(const_brotli::HuffmanTree_&,_const_brotli::HuffmanTree_&)>
                    )0x17bec6);
        if ((long)uVar14 < 0x81) {
          pHVar11 = __dest;
          pHVar10 = __first;
          if (lVar26 != 8) {
            do {
              pHVar12 = pHVar11;
              HVar3 = *pHVar12;
              if (pHVar12->total_count_ < __first->total_count_) {
                memmove((void *)((long)pHVar10 + (0x10 - ((long)pHVar12 - (long)__first))),__first,
                        (long)pHVar12 - (long)__first);
                pHVar11 = __first;
              }
              else {
                uVar1 = pHVar10->total_count_;
                pHVar11 = pHVar12;
                while (HVar3.total_count_ < uVar1) {
                  *pHVar11 = pHVar11[-1];
                  uVar1 = pHVar11[-2].total_count_;
                  pHVar11 = pHVar11 + -1;
                }
              }
              *pHVar11 = HVar3;
              pHVar11 = pHVar12 + 1;
              pHVar10 = pHVar12;
            } while (pHVar12 + 1 != pHVar27);
          }
        }
        else {
          __n = 8;
          pHVar11 = __dest;
          pHVar10 = __first;
          local_50 = lVar26;
          do {
            pHVar12 = (HuffmanTree *)((long)&__first->total_count_ + __n);
            HVar3 = *(HuffmanTree *)((long)&__first->total_count_ + __n);
            if (*(uint *)((long)&__first->total_count_ + __n) < __first->total_count_) {
              memmove(__dest,__first,__n);
              pHVar10 = __first;
            }
            else {
              uVar1 = pHVar10->total_count_;
              pHVar10 = pHVar12;
              pHVar5 = pHVar11;
              while (HVar3.total_count_ < uVar1) {
                pHVar10 = pHVar5 + -1;
                *pHVar5 = pHVar5[-1];
                uVar1 = pHVar5[-2].total_count_;
                pHVar5 = pHVar10;
              }
            }
            *pHVar10 = HVar3;
            __n = __n + 8;
            pHVar11 = pHVar11 + 1;
            pHVar10 = pHVar12;
          } while (__n != 0x80);
          pHVar11 = local_68;
          if (local_50 != 0x80) {
            do {
              HVar3 = *pHVar11;
              uVar1 = pHVar11[-1].total_count_;
              pHVar10 = pHVar11;
              while (HVar3.total_count_ < uVar1) {
                *pHVar10 = pHVar10[-1];
                uVar1 = pHVar10[-2].total_count_;
                pHVar10 = pHVar10 + -1;
              }
              *pHVar10 = HVar3;
              pHVar11 = pHVar11 + 1;
            } while (pHVar11 != pHVar27);
          }
        }
      }
      pHVar27->total_count_ = 0x7fffffff;
      pHVar27->index_left_ = -1;
      pHVar27->index_right_or_value_ = -1;
      pHVar27[1].total_count_ = 0x7fffffff;
      pHVar27[1].index_left_ = -1;
      pHVar27[1].index_right_or_value_ = -1;
      iVar6 = (int)(local_a8[4] >> 3);
      if (1 < iVar6) {
        iVar7 = iVar6 + 1;
        pHVar27 = pHVar27 + 2;
        iVar13 = 0;
        iVar17 = iVar7;
        do {
          uVar2 = __first[iVar13].total_count_;
          uVar1 = __first[iVar17].total_count_;
          iVar21 = iVar13;
          if (uVar1 < uVar2) {
            iVar21 = iVar17;
          }
          iVar13 = iVar13 + (uint)(uVar2 <= uVar1);
          iVar17 = iVar17 + (uint)(uVar1 < uVar2);
          uVar2 = __first[iVar13].total_count_;
          uVar1 = __first[iVar17].total_count_;
          iVar24 = iVar13;
          if (uVar1 < uVar2) {
            iVar24 = iVar17;
          }
          iVar13 = iVar13 + (uint)(uVar2 <= uVar1);
          iVar17 = iVar17 + (uint)(uVar1 < uVar2);
          pHVar27[-1].total_count_ = __first[iVar24].total_count_ + __first[iVar21].total_count_;
          pHVar27[-1].index_left_ = (int16_t)iVar21;
          pHVar27[-1].index_right_or_value_ = (int16_t)iVar24;
          pHVar27->total_count_ = 0x7fffffff;
          pHVar27->index_left_ = -1;
          pHVar27->index_right_or_value_ = -1;
          pHVar27 = pHVar27 + 1;
          iVar7 = iVar7 + -1;
        } while (2 < iVar7);
      }
      SetDepth(local_40 + iVar6 * 2,__first,depth,'\0');
      lVar26 = local_60;
      pbVar15 = local_58;
      pbVar18 = depth;
      pbVar22 = depth;
      if (1 < uVar20) {
        do {
          pbVar18 = pbVar15;
          if (*pbVar15 <= *pbVar22) {
            pbVar18 = pbVar22;
          }
          lVar26 = lVar26 + -1;
          pbVar15 = pbVar15 + 1;
          pbVar22 = pbVar18;
        } while (lVar26 != 0);
      }
      uVar29 = uVar29 * 2;
    } while (0xe < *pbVar18);
    free(__first);
    ConvertBitDepthsToSymbols(depth,uVar20,local_78);
    uVar14 = local_70;
    if (4 < local_70) {
      uVar14 = *storage_ix;
      *(ulong *)(storage + (uVar14 >> 3)) =
           0xff55555554 << ((byte)uVar14 & 7) | (ulong)storage[uVar14 >> 3];
      *storage_ix = uVar14 + 0x28;
      if (uVar20 == 0) {
        return;
      }
      uVar14 = 0;
      bVar28 = 8;
      do {
        bVar19 = depth[uVar14];
        uVar23 = 1;
        uVar8 = uVar23;
        if (uVar14 + 1 < uVar20) {
          do {
            uVar8 = uVar23;
            if (depth[uVar23 + uVar14] != bVar19) break;
            uVar23 = uVar23 + 1;
            uVar8 = uVar20 - uVar14;
          } while (uVar20 - uVar14 != uVar23);
        }
        if (bVar19 == 0) {
          uVar29 = (&kZeroRepsDepth)[uVar8];
          uVar23 = (&kZeroRepsBits)[uVar8];
          bVar19 = bVar28;
          if (uVar23 >> ((byte)uVar29 & 0x3f) != 0) goto LAB_00179793;
LAB_001795c3:
          uVar16 = *storage_ix;
          *(ulong *)(storage + (uVar16 >> 3)) =
               uVar23 << ((byte)uVar16 & 7) | (ulong)storage[uVar16 >> 3];
          *storage_ix = uVar29 + uVar16;
        }
        else {
          uVar16 = (ulong)bVar19;
          uVar23 = uVar8;
          if (bVar28 != bVar19) {
            bVar28 = kCodeLengthDepth[uVar16];
            if (*(uint *)(kCodeLengthBits + uVar16 * 4) >> (bVar28 & 0x3f) != 0) goto LAB_00179793;
            uVar23 = *storage_ix;
            *(ulong *)(storage + (uVar23 >> 3)) =
                 (ulong)*(uint *)(kCodeLengthBits + uVar16 * 4) << ((byte)uVar23 & 7) |
                 (ulong)storage[uVar23 >> 3];
            *storage_ix = bVar28 + uVar23;
            uVar23 = uVar8 - 1;
          }
          if (2 < uVar23) {
            uVar29 = *(uint *)(kCodeLengthBits + uVar23 * 4 + 0x44);
            uVar23 = *(ulong *)(kNonZeroRepsDepth + uVar23 * 8 + 0xae8);
            if (uVar23 >> ((byte)uVar29 & 0x3f) == 0) goto LAB_001795c3;
            goto LAB_00179793;
          }
          if (uVar23 != 0) {
            bVar28 = kCodeLengthDepth[uVar16];
            uVar29 = *(uint *)(kCodeLengthBits + uVar16 * 4);
            do {
              if (uVar29 >> (bVar28 & 0x3f) != 0) goto LAB_00179793;
              uVar16 = *storage_ix;
              *(ulong *)(storage + (uVar16 >> 3)) =
                   (ulong)uVar29 << ((byte)uVar16 & 7) | (ulong)storage[uVar16 >> 3];
              *storage_ix = uVar16 + bVar28;
              uVar23 = uVar23 - 1;
            } while (uVar23 != 0);
          }
        }
        uVar14 = uVar14 + uVar8;
        bVar28 = bVar19;
        if (uVar20 <= uVar14) {
          return;
        }
      } while( true );
    }
    uVar8 = *storage_ix;
    *(ulong *)(storage + (uVar8 >> 3)) = (ulong)storage[uVar8 >> 3] | 1L << ((byte)uVar8 & 7);
    uVar20 = uVar8 + 2;
    *storage_ix = uVar20;
    *(ulong *)(storage + (uVar20 >> 3)) =
         local_70 - 1 << ((byte)uVar20 & 7) | (ulong)storage[uVar20 >> 3];
    uVar8 = uVar8 + 4;
    *storage_ix = uVar8;
    uVar20 = 0;
    do {
      uVar16 = uVar20 + 1;
      max_bits = local_80;
      for (uVar23 = uVar16; local_80 = max_bits, uVar23 < uVar14; uVar23 = uVar23 + 1) {
        uVar4 = local_a8[uVar23];
        if (depth[uVar4] < depth[local_a8[uVar20]]) {
          local_a8[uVar23] = local_a8[uVar20];
          local_a8[uVar20] = uVar4;
        }
        max_bits = local_80;
      }
      uVar20 = uVar16;
    } while (uVar16 != uVar14);
    bVar28 = (byte)max_bits;
    uVar20 = local_a8[0] >> (bVar28 & 0x3f);
    bVar19 = (byte)uVar8;
    if (uVar14 == 2) {
      if (uVar20 != 0) goto LAB_00179793;
      if (0x38 < max_bits) goto LAB_001797b2;
      *(ulong *)(storage + (uVar8 >> 3)) = local_a8[0] << (bVar19 & 7) | (ulong)storage[uVar8 >> 3];
      uVar8 = uVar8 + max_bits;
      *storage_ix = uVar8;
      uVar14 = local_a8[1];
    }
    else {
      if (uVar14 != 3) {
        if (uVar20 != 0) goto LAB_00179793;
        if (0x38 < max_bits) {
LAB_001797b2:
          __assert_fail("n_bits <= 56",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/urbit[P]h2o/deps/brotli/enc/././write_bits.h"
                        ,0x2d,
                        "void brotli::WriteBits(size_t, uint64_t, size_t *__restrict, uint8_t *__restrict)"
                       );
        }
        *(ulong *)(storage + (uVar8 >> 3)) =
             local_a8[0] << (bVar19 & 7) | (ulong)storage[uVar8 >> 3];
        uVar8 = uVar8 + max_bits;
        *storage_ix = uVar8;
        if (local_a8[1] >> (bVar28 & 0x3f) != 0) goto LAB_00179793;
        *(ulong *)(storage + (uVar8 >> 3)) =
             local_a8[1] << ((byte)uVar8 & 7) | (ulong)storage[uVar8 >> 3];
        uVar8 = uVar8 + max_bits;
        *storage_ix = uVar8;
        if (local_a8[2] >> (bVar28 & 0x3f) != 0) goto LAB_00179793;
        *(ulong *)(storage + (uVar8 >> 3)) =
             local_a8[2] << ((byte)uVar8 & 7) | (ulong)storage[uVar8 >> 3];
        uVar8 = uVar8 + max_bits;
        *storage_ix = uVar8;
        if (local_a8[3] >> (bVar28 & 0x3f) != 0) goto LAB_00179793;
        *(ulong *)(storage + (uVar8 >> 3)) =
             local_a8[3] << ((byte)uVar8 & 7) | (ulong)storage[uVar8 >> 3];
        uVar14 = uVar8 + max_bits;
        *storage_ix = uVar14;
        *(ulong *)(storage + (uVar14 >> 3)) =
             (ulong)(depth[local_a8[0]] == '\x01') << ((byte)uVar14 & 7) |
             (ulong)storage[uVar14 >> 3];
        sVar25 = max_bits + uVar8 + 1;
        goto LAB_00179673;
      }
      if (uVar20 != 0) goto LAB_00179793;
      if (0x38 < max_bits) goto LAB_001797b2;
      *(ulong *)(storage + (uVar8 >> 3)) = local_a8[0] << (bVar19 & 7) | (ulong)storage[uVar8 >> 3];
      uVar8 = uVar8 + max_bits;
      *storage_ix = uVar8;
      if (local_a8[1] >> (bVar28 & 0x3f) != 0) goto LAB_00179793;
      *(ulong *)(storage + (uVar8 >> 3)) =
           local_a8[1] << ((byte)uVar8 & 7) | (ulong)storage[uVar8 >> 3];
      uVar8 = uVar8 + max_bits;
      *storage_ix = uVar8;
      uVar14 = local_a8[2];
    }
    if (uVar14 >> (bVar28 & 0x3f) != 0) {
LAB_00179793:
      __assert_fail("(bits >> n_bits) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/urbit[P]h2o/deps/brotli/enc/././write_bits.h"
                    ,0x2c,
                    "void brotli::WriteBits(size_t, uint64_t, size_t *__restrict, uint8_t *__restrict)"
                   );
    }
    *(ulong *)(storage + (uVar8 >> 3)) = uVar14 << ((byte)uVar8 & 7) | (ulong)storage[uVar8 >> 3];
  }
  sVar25 = max_bits + uVar8;
LAB_00179673:
  *storage_ix = sVar25;
  return;
}

Assistant:

void BuildAndStoreHuffmanTreeFast(const uint32_t *histogram,
                                  const size_t histogram_total,
                                  const size_t max_bits,
                                  uint8_t* depth,
                                  uint16_t* bits,
                                  size_t* storage_ix,
                                  uint8_t* storage) {
  size_t count = 0;
  size_t symbols[4] = { 0 };
  size_t length = 0;
  size_t total = histogram_total;
  while (total != 0) {
    if (histogram[length]) {
      if (count < 4) {
        symbols[count] = length;
      }
      ++count;
      total -= histogram[length];
    }
    ++length;
  }

  if (count <= 1) {
    WriteBits(4, 1, storage_ix, storage);
    WriteBits(max_bits, symbols[0], storage_ix, storage);
    return;
  }

  const size_t max_tree_size = 2 * length + 1;
  HuffmanTree* const tree =
      static_cast<HuffmanTree*>(malloc(max_tree_size * sizeof(HuffmanTree)));
  for (uint32_t count_limit = 1; ; count_limit *= 2) {
    HuffmanTree* node = tree;
    for (size_t i = length; i != 0;) {
      --i;
      if (histogram[i]) {
        if (PREDICT_TRUE(histogram[i] >= count_limit)) {
          *node = HuffmanTree(histogram[i], -1, static_cast<int16_t>(i));
        } else {
          *node = HuffmanTree(count_limit, -1, static_cast<int16_t>(i));
        }
        ++node;
      }
    }
    const int n = static_cast<int>(node - tree);
    std::sort(tree, node, SortHuffmanTree);
    // The nodes are:
    // [0, n): the sorted leaf nodes that we start with.
    // [n]: we add a sentinel here.
    // [n + 1, 2n): new parent nodes are added here, starting from
    //              (n+1). These are naturally in ascending order.
    // [2n]: we add a sentinel at the end as well.
    // There will be (2n+1) elements at the end.
    const HuffmanTree sentinel(std::numeric_limits<int>::max(), -1, -1);
    *node++ = sentinel;
    *node++ = sentinel;

    int i = 0;      // Points to the next leaf node.
    int j = n + 1;  // Points to the next non-leaf node.
    for (int k = n - 1; k > 0; --k) {
      int left, right;
      if (tree[i].total_count_ <= tree[j].total_count_) {
        left = i;
        ++i;
      } else {
        left = j;
        ++j;
      }
      if (tree[i].total_count_ <= tree[j].total_count_) {
        right = i;
        ++i;
      } else {
        right = j;
        ++j;
      }
      // The sentinel node becomes the parent node.
      node[-1].total_count_ =
          tree[left].total_count_ + tree[right].total_count_;
      node[-1].index_left_ = static_cast<int16_t>(left);
      node[-1].index_right_or_value_ = static_cast<int16_t>(right);
      // Add back the last sentinel node.
      *node++ = sentinel;
    }
    SetDepth(tree[2 * n - 1], &tree[0], depth, 0);
    // We need to pack the Huffman tree in 14 bits.
    // If this was not successful, add fake entities to the lowest values
    // and retry.
    if (PREDICT_TRUE(*std::max_element(&depth[0], &depth[length]) <= 14)) {
      break;
    }
  }
  free(tree);
  ConvertBitDepthsToSymbols(depth, length, bits);
  if (count <= 4) {
    // value of 1 indicates a simple Huffman code
    WriteBits(2, 1, storage_ix, storage);
    WriteBits(2, count - 1, storage_ix, storage);  // NSYM - 1

    // Sort
    for (size_t i = 0; i < count; i++) {
      for (size_t j = i + 1; j < count; j++) {
        if (depth[symbols[j]] < depth[symbols[i]]) {
          std::swap(symbols[j], symbols[i]);
        }
      }
    }

    if (count == 2) {
      WriteBits(max_bits, symbols[0], storage_ix, storage);
      WriteBits(max_bits, symbols[1], storage_ix, storage);
    } else if (count == 3) {
      WriteBits(max_bits, symbols[0], storage_ix, storage);
      WriteBits(max_bits, symbols[1], storage_ix, storage);
      WriteBits(max_bits, symbols[2], storage_ix, storage);
    } else {
      WriteBits(max_bits, symbols[0], storage_ix, storage);
      WriteBits(max_bits, symbols[1], storage_ix, storage);
      WriteBits(max_bits, symbols[2], storage_ix, storage);
      WriteBits(max_bits, symbols[3], storage_ix, storage);
      // tree-select
      WriteBits(1, depth[symbols[0]] == 1 ? 1 : 0, storage_ix, storage);
    }
  } else {
    // Complex Huffman Tree
    StoreStaticCodeLengthCode(storage_ix, storage);

    // Actual rle coding.
    uint8_t previous_value = 8;
    for (size_t i = 0; i < length;) {
      const uint8_t value = depth[i];
      size_t reps = 1;
      for (size_t k = i + 1; k < length && depth[k] == value; ++k) {
        ++reps;
      }
      i += reps;
      if (value == 0) {
        WriteBits(kZeroRepsDepth[reps], kZeroRepsBits[reps],
                  storage_ix, storage);
      } else {
        if (previous_value != value) {
          WriteBits(kCodeLengthDepth[value], kCodeLengthBits[value],
                    storage_ix, storage);
          --reps;
        }
        if (reps < 3) {
          while (reps != 0) {
            reps--;
            WriteBits(kCodeLengthDepth[value], kCodeLengthBits[value],
                      storage_ix, storage);
          }
        } else {
          reps -= 3;
          WriteBits(kNonZeroRepsDepth[reps], kNonZeroRepsBits[reps],
                    storage_ix, storage);
        }
        previous_value = value;
      }
    }
  }
}